

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_encoder.c
# Opt level: O1

lzma_ret delta_encode(void *coder_ptr,lzma_allocator *allocator,uint8_t *in,size_t *in_pos,
                     size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,lzma_action action)

{
  byte bVar1;
  char cVar2;
  uint8_t uVar3;
  char cVar4;
  size_t sVar5;
  lzma_ret lVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  
  if (*(code **)((long)coder_ptr + 0x18) == (code *)0x0) {
    sVar10 = *in_pos;
    sVar5 = *out_pos;
    uVar9 = out_size - sVar5;
    if (in_size - sVar10 < out_size - sVar5) {
      uVar9 = in_size - sVar10;
    }
    if (uVar9 != 0) {
      cVar2 = *(char *)((long)coder_ptr + 0x48);
      bVar8 = *(byte *)((long)coder_ptr + 0x50);
      uVar11 = 0;
      do {
        bVar1 = cVar2 + bVar8;
        uVar3 = in[uVar11 + sVar10];
        uVar7 = (ulong)bVar8;
        bVar8 = bVar8 - 1;
        cVar4 = *(char *)((long)coder_ptr + (ulong)bVar1 + 0x51);
        *(uint8_t *)((long)coder_ptr + uVar7 + 0x51) = uVar3;
        out[uVar11 + sVar5] = uVar3 - cVar4;
        uVar11 = uVar11 + 1;
      } while (uVar9 != uVar11);
      *(byte *)((long)coder_ptr + 0x50) = bVar8;
    }
    *in_pos = sVar10 + uVar9;
    *out_pos = sVar5 + uVar9;
    if (action == LZMA_RUN) {
      lVar6 = LZMA_OK;
    }
    else {
      lVar6 = (lzma_ret)(sVar10 + uVar9 == in_size);
    }
  }
  else {
    sVar10 = *out_pos;
    lVar6 = (**(code **)((long)coder_ptr + 0x18))(*coder_ptr);
    sVar5 = *out_pos;
    if (sVar5 != sVar10) {
      cVar2 = *(char *)((long)coder_ptr + 0x48);
      bVar8 = *(byte *)((long)coder_ptr + 0x50);
      do {
        bVar1 = cVar2 + bVar8;
        uVar3 = out[sVar10];
        uVar9 = (ulong)bVar8;
        bVar8 = bVar8 - 1;
        cVar4 = *(char *)((long)coder_ptr + (ulong)bVar1 + 0x51);
        *(uint8_t *)((long)coder_ptr + uVar9 + 0x51) = uVar3;
        out[sVar10] = uVar3 - cVar4;
        sVar10 = sVar10 + 1;
      } while (sVar5 != sVar10);
      *(byte *)((long)coder_ptr + 0x50) = bVar8;
    }
  }
  return lVar6;
}

Assistant:

static lzma_ret
delta_encode(void *coder_ptr, const lzma_allocator *allocator,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size, lzma_action action)
{
	lzma_delta_coder *coder = coder_ptr;

	lzma_ret ret;

	if (coder->next.code == NULL) {
		const size_t in_avail = in_size - *in_pos;
		const size_t out_avail = out_size - *out_pos;
		const size_t size = my_min(in_avail, out_avail);

		copy_and_encode(coder, in + *in_pos, out + *out_pos, size);

		*in_pos += size;
		*out_pos += size;

		ret = action != LZMA_RUN && *in_pos == in_size
				? LZMA_STREAM_END : LZMA_OK;

	} else {
		const size_t out_start = *out_pos;

		ret = coder->next.code(coder->next.coder, allocator,
				in, in_pos, in_size, out, out_pos, out_size,
				action);

		encode_in_place(coder, out + out_start, *out_pos - out_start);
	}

	return ret;
}